

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults> * __thiscall
kj::_::PromiseAwaiter<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_>::
await_resume(Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>
             *__return_storage_ptr__,
            PromiseAwaiter<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_>
            *this)

{
  Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults> *pRVar1;
  void *unaff_retaddr;
  Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults> *value;
  PromiseAwaiter<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_>
  *this_local;
  
  PromiseAwaiterBase::awaitResumeImpl
            (&this->super_PromiseAwaiterBase,&(this->result).super_ExceptionOrValue,unaff_retaddr);
  pRVar1 = readMaybe<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>>
                     (&(this->result).value);
  if (pRVar1 != (Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults> *)0x0) {
    pRVar1 = mv<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>>(pRVar1);
    ::capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>::Response
              (__return_storage_ptr__,pRVar1);
    return __return_storage_ptr__;
  }
  inlineRequireFailure
            ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h"
             ,0x9d4,"value != nullptr","\"Neither exception nor value present.\"",
             "Neither exception nor value present.");
}

Assistant:

KJ_NOINLINE T await_resume() {
    // This is marked noinline in order to ensure __builtin_return_address() is accurate for stack
    // trace purposes. In my experimentation, this method was not inlined anyway even in opt
    // builds, but I want to make sure it doesn't suddenly start being inlined later causing stack
    // traces to break. (I also tried always-inline, but this did not appear to cause the compiler
    // to inline the method -- perhaps a limitation of coroutines?)
#if __GNUC__
    awaitResumeImpl(result, __builtin_return_address(0));
#elif _MSC_VER
    awaitResumeImpl(result, _ReturnAddress());
#else
    #error "please implement for your compiler"
#endif
    auto value = kj::_::readMaybe(result.value);
    KJ_IASSERT(value != nullptr, "Neither exception nor value present.");
    return T(kj::mv(*value));
  }